

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2413.c
# Opt level: O1

void load_instrument(YM2413 *chip,UINT32 chan,UINT32 slot,UINT8 *inst)

{
  OPLL_SLOT *pOVar1;
  OPLL_SLOT *pOVar2;
  byte bVar3;
  UINT32 UVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uchar uVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  byte bVar14;
  
  bVar3 = *inst;
  uVar7 = slot >> 1;
  uVar6 = slot & 1;
  bVar14 = "\x01\x02\x04\x06\b\n\f\x0e\x10\x12\x14\x14\x18\x18\x1e\x1e"[(int)(char)bVar3 & 0xf];
  chip->P_CH[uVar7].SLOT[uVar6].mul = bVar14;
  bVar5 = (byte)~bVar3 >> 3 & 2;
  chip->P_CH[uVar7].SLOT[uVar6].KSR = bVar5;
  chip->P_CH[uVar7].SLOT[uVar6].eg_type = bVar3 & 0x20;
  chip->P_CH[uVar7].SLOT[uVar6].vib = bVar3 & 0x40;
  chip->P_CH[uVar7].SLOT[uVar6].AMmask = (int)(char)bVar3 >> 7;
  chip->P_CH[uVar7].SLOT[uVar6].freq = (uint)bVar14 * chip->P_CH[uVar7].fc;
  bVar3 = chip->P_CH[uVar7].kcode >> bVar5;
  uVar11 = (uint)bVar3;
  pOVar1 = chip->P_CH[uVar7].SLOT + uVar6;
  if (uVar11 != chip->P_CH[uVar7].SLOT[uVar6].ksr) {
    pOVar1->ksr = bVar3;
    uVar6 = pOVar1->ar + uVar11;
    if (uVar6 < 0x4e) {
      pOVar1->eg_sh_ar = ""[uVar6];
      uVar9 = "pppppppppppppppp"[uVar6];
    }
    else {
      pOVar1->eg_sh_ar = '\0';
      uVar9 = 'h';
    }
    pOVar1->eg_sel_ar = uVar9;
    uVar6 = pOVar1->dr + uVar11;
    pOVar1->eg_sh_dr = ""[uVar6];
    pOVar1->eg_sel_dr = "pppppppppppppppp"[uVar6];
    uVar11 = uVar11 + pOVar1->rr;
    pOVar1->eg_sh_rr = ""[uVar11];
    pOVar1->eg_sel_rr = "pppppppppppppppp"[uVar11];
  }
  uVar10 = (ulong)pOVar1->ksr;
  lVar12 = uVar10 + 0x24 + (ulong)(chip->P_CH[uVar7].sus == '\0') * 8;
  pOVar1->eg_sh_rs = ""[lVar12];
  pOVar1->eg_sel_rs = "pppppppppppppppp"[lVar12];
  pOVar1->eg_sh_dp = ""[uVar10 + 0x44];
  pOVar1->eg_sel_dp = "pppppppppppppppp"[uVar10 + 0x44];
  bVar3 = inst[1];
  uVar7 = slot + 1 >> 1;
  uVar6 = slot + 1 & 1;
  bVar14 = "\x01\x02\x04\x06\b\n\f\x0e\x10\x12\x14\x14\x18\x18\x1e\x1e"[(int)(char)bVar3 & 0xf];
  chip->P_CH[uVar7].SLOT[uVar6].mul = bVar14;
  bVar5 = (byte)~bVar3 >> 3 & 2;
  chip->P_CH[uVar7].SLOT[uVar6].KSR = bVar5;
  chip->P_CH[uVar7].SLOT[uVar6].eg_type = bVar3 & 0x20;
  chip->P_CH[uVar7].SLOT[uVar6].vib = bVar3 & 0x40;
  chip->P_CH[uVar7].SLOT[uVar6].AMmask = (int)(char)bVar3 >> 7;
  chip->P_CH[uVar7].SLOT[uVar6].freq = (uint)bVar14 * chip->P_CH[uVar7].fc;
  bVar3 = chip->P_CH[uVar7].kcode >> bVar5;
  uVar11 = (uint)bVar3;
  pOVar2 = chip->P_CH[uVar7].SLOT + uVar6;
  if (uVar11 != chip->P_CH[uVar7].SLOT[uVar6].ksr) {
    pOVar2->ksr = bVar3;
    uVar6 = pOVar2->ar + uVar11;
    if (uVar6 < 0x4e) {
      pOVar2->eg_sh_ar = ""[uVar6];
      uVar9 = "pppppppppppppppp"[uVar6];
    }
    else {
      pOVar2->eg_sh_ar = '\0';
      uVar9 = 'h';
    }
    pOVar2->eg_sel_ar = uVar9;
    uVar6 = pOVar2->dr + uVar11;
    pOVar2->eg_sh_dr = ""[uVar6];
    pOVar2->eg_sel_dr = "pppppppppppppppp"[uVar6];
    uVar11 = uVar11 + pOVar2->rr;
    pOVar2->eg_sh_rr = ""[uVar11];
    pOVar2->eg_sel_rr = "pppppppppppppppp"[uVar11];
  }
  uVar10 = (ulong)pOVar2->ksr;
  lVar12 = uVar10 + 0x24 + (ulong)(chip->P_CH[uVar7].sus == '\0') * 8;
  pOVar2->eg_sh_rs = ""[lVar12];
  pOVar2->eg_sel_rs = "pppppppppppppppp"[lVar12];
  pOVar2->eg_sh_dp = ""[uVar10 + 0x44];
  pOVar2->eg_sel_dp = "pppppppppppppppp"[uVar10 + 0x44];
  bVar3 = inst[2];
  UVar4 = ksl_shift[bVar3 >> 6];
  chip->P_CH[chan].SLOT[0].ksl = (byte)UVar4;
  uVar6 = (uint)bVar3 + (uint)bVar3 & 0x7e;
  chip->P_CH[chan].SLOT[0].TL = uVar6;
  uVar7 = chip->P_CH[chan].ksl_base;
  chip->P_CH[chan].SLOT[0].TLL = (uVar7 >> ((byte)UVar4 & 0x1f)) + uVar6;
  bVar3 = inst[3];
  chip->P_CH[chan].SLOT[0].wavetable = (bVar3 & 8) << 7;
  bVar14 = (bVar3 & 7) + 8;
  if ((bVar3 & 7) == 0) {
    bVar14 = bVar3 & 7;
  }
  chip->P_CH[chan].SLOT[0].fb_shift = bVar14;
  UVar4 = ksl_shift[bVar3 >> 6];
  chip->P_CH[chan].SLOT[1].ksl = (byte)UVar4;
  chip->P_CH[chan].SLOT[1].TLL = (uVar7 >> ((byte)UVar4 & 0x1f)) + chip->P_CH[chan].SLOT[1].TL;
  chip->P_CH[chan].SLOT[1].wavetable = (bVar3 & 0x10) << 6;
  bVar3 = inst[4];
  uVar13 = (ulong)((uint)(bVar3 >> 4) * 4 + 0x10);
  if (bVar3 < 0x10) {
    uVar13 = 0;
  }
  pOVar1->ar = (UINT32)uVar13;
  uVar8 = (ulong)pOVar1->ksr;
  lVar12 = uVar13 + uVar8;
  if ((uint)lVar12 < 0x4e) {
    pOVar1->eg_sh_ar = ""[lVar12];
    uVar9 = "pppppppppppppppp"[lVar12];
  }
  else {
    pOVar1->eg_sh_ar = '\0';
    uVar9 = 'h';
  }
  pOVar1->eg_sel_ar = uVar9;
  uVar7 = (bVar3 & 0xf) * 4 + 0x10;
  if ((bVar3 & 0xf) == 0) {
    uVar7 = bVar3 & 0xf;
  }
  pOVar1->dr = uVar7;
  pOVar1->eg_sh_dr = ""[uVar7 + uVar8];
  pOVar1->eg_sel_dr = "pppppppppppppppp"[uVar7 + uVar8];
  bVar3 = inst[5];
  uVar13 = (ulong)((uint)(bVar3 >> 4) * 4 + 0x10);
  if (bVar3 < 0x10) {
    uVar13 = 0;
  }
  pOVar2->ar = (UINT32)uVar13;
  lVar12 = uVar13 + uVar10;
  if ((uint)lVar12 < 0x4e) {
    pOVar2->eg_sh_ar = ""[lVar12];
    uVar9 = "pppppppppppppppp"[lVar12];
  }
  else {
    pOVar2->eg_sh_ar = '\0';
    uVar9 = 'h';
  }
  pOVar2->eg_sel_ar = uVar9;
  uVar7 = (bVar3 & 0xf) * 4 + 0x10;
  if ((bVar3 & 0xf) == 0) {
    uVar7 = bVar3 & 0xf;
  }
  pOVar2->dr = uVar7;
  pOVar2->eg_sh_dr = ""[uVar7 + uVar10];
  pOVar2->eg_sel_dr = "pppppppppppppppp"[uVar7 + uVar10];
  bVar3 = inst[6];
  pOVar1->sl = sl_tab[bVar3 >> 4];
  uVar7 = (bVar3 & 0xf) * 4 + 0x10;
  if ((bVar3 & 0xf) == 0) {
    uVar7 = bVar3 & 0xf;
  }
  pOVar1->rr = uVar7;
  pOVar1->eg_sh_rr = ""[uVar7 + uVar8];
  pOVar1->eg_sel_rr = "pppppppppppppppp"[uVar7 + uVar8];
  bVar3 = inst[7];
  uVar7 = (bVar3 & 0xf) * 4 + 0x10;
  if ((bVar3 & 0xf) == 0) {
    uVar7 = bVar3 & 0xf;
  }
  pOVar2->sl = sl_tab[bVar3 >> 4];
  pOVar2->rr = uVar7;
  pOVar2->eg_sh_rr = ""[uVar10 + uVar7];
  pOVar2->eg_sel_rr = "pppppppppppppppp"[uVar10 + uVar7];
  return;
}

Assistant:

static void load_instrument(YM2413 *chip, UINT32 chan, UINT32 slot, UINT8* inst )
{
	set_mul         (chip, slot,   inst[0]);
	set_mul         (chip, slot+1, inst[1]);
	set_ksl_tl      (chip, chan,   inst[2]);
	set_ksl_wave_fb (chip, chan,   inst[3]);
	set_ar_dr       (chip, slot,   inst[4]);
	set_ar_dr       (chip, slot+1, inst[5]);
	set_sl_rr       (chip, slot,   inst[6]);
	set_sl_rr       (chip, slot+1, inst[7]);
}